

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprImpliesNonNullRow(Expr *p,int iTab,int isRJ)

{
  int iVar1;
  int in_EDX;
  undefined4 in_ESI;
  Expr *in_RDI;
  long in_FS_OFFSET;
  Walker w;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  Expr *local_48;
  uint local_3c;
  undefined1 local_38 [8];
  code *local_30;
  undefined8 local_28;
  undefined8 local_20;
  ushort local_14;
  ushort local_12;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_38,0xaa,0x30);
  local_48 = sqlite3ExprSkipCollateAndLikely(in_RDI);
  if (local_48 == (Expr *)0x0) {
    local_3c = 0;
  }
  else {
    if (local_48->op != '4') {
      for (; local_48->op == ','; local_48 = local_48->pRight) {
        iVar1 = sqlite3ExprImpliesNonNullRow
                          ((Expr *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffac,
                           in_stack_ffffffffffffffa8);
        if (iVar1 != 0) {
          local_3c = 1;
          goto LAB_001d1151;
        }
      }
    }
    local_30 = impliesNotNullRow;
    local_28 = 0;
    local_20 = 0;
    local_14 = 0;
    local_12 = (ushort)(in_EDX != 0);
    sqlite3WalkExpr((Walker *)CONCAT44(in_ESI,in_EDX),
                    (Expr *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    local_3c = (uint)local_14;
  }
LAB_001d1151:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_3c;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprImpliesNonNullRow(Expr *p, int iTab, int isRJ){
  Walker w;
  p = sqlite3ExprSkipCollateAndLikely(p);
  if( p==0 ) return 0;
  if( p->op==TK_NOTNULL ){
    p = p->pLeft;
  }else{
    while( p->op==TK_AND ){
      if( sqlite3ExprImpliesNonNullRow(p->pLeft, iTab, isRJ) ) return 1;
      p = p->pRight;
    }
  }
  w.xExprCallback = impliesNotNullRow;
  w.xSelectCallback = 0;
  w.xSelectCallback2 = 0;
  w.eCode = 0;
  w.mWFlags = isRJ!=0;
  w.u.iCur = iTab;
  sqlite3WalkExpr(&w, p);
  return w.eCode;
}